

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O1

uint64_t dsOffset(void *address)

{
  void *pvVar1;
  char *pcVar2;
  char *fmt;
  
  pthread_once(&keyOnce,makeKey);
  pvVar1 = pthread_getspecific(key);
  if (pvVar1 == (void *)0x0) {
    fmt = "%s(): Can\'t get active crate.\n";
    pcVar2 = "dsOffset";
  }
  else {
    if (*(long *)((long)pvVar1 + 0x10) <= (long)address) {
      return (long)address - *(long *)((long)pvVar1 + 0x10);
    }
    fmt = "%s(): Pointer falls outside of the crate.\n";
    pcVar2 = "objectOffset";
  }
  dsRunLogCallback(fmt,pcVar2);
  return 0xffffffffffffffff;
}

Assistant:

uint64_t
dsOffset(void *address)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return UINT64_MAX;
	}

	return objectOffset(crate, address);
}